

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

void __thiscall Lodtalk::GarbageCollector::~GarbageCollector(GarbageCollector *this)

{
  GarbageCollector *this_local;
  
  std::vector<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_>::~vector
            (&this->currentStacks);
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::~vector(&this->nativeObjects);
  std::
  vector<std::pair<Lodtalk::Oop_*,_unsigned_long>,_std::allocator<std::pair<Lodtalk::Oop_*,_unsigned_long>_>_>
  ::~vector(&this->rootPointers);
  return;
}

Assistant:

GarbageCollector::~GarbageCollector()
{
}